

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O2

int timeval_to_relative_ms(timeval *tv)

{
  bool bVar1;
  int iVar2;
  __suseconds_t _Var3;
  long lVar4;
  long lVar5;
  timeval now;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  lVar4 = tv->tv_sec;
  lVar5 = lVar4 - local_20.tv_sec;
  if (lVar5 != 0) {
    if (lVar5 != 0 && local_20.tv_sec <= lVar4) {
      _Var3 = tv->tv_usec;
      goto LAB_001088ed;
    }
    _Var3 = tv->tv_usec;
  }
  else {
    _Var3 = tv->tv_usec;
    if (local_20.tv_usec <= _Var3) {
LAB_001088ed:
      lVar4 = _Var3 - local_20.tv_usec;
      bVar1 = true;
      if (lVar4 < 0) {
        lVar5 = lVar5 + -1;
        lVar4 = lVar4 + 1000000;
      }
      goto LAB_00108922;
    }
  }
  lVar5 = local_20.tv_sec - lVar4;
  lVar4 = local_20.tv_usec - _Var3;
  if (lVar4 < 0) {
    lVar5 = lVar5 + -1;
    lVar4 = lVar4 + 1000000;
  }
  bVar1 = false;
LAB_00108922:
  lVar4 = (lVar4 + 500) / 1000 + lVar5 * 1000;
  if (lVar4 < -0x7fffffff) {
    lVar4 = -0x80000000;
  }
  if (0x7ffffffe < lVar4) {
    lVar4 = 0x7fffffff;
  }
  iVar2 = (int)lVar4;
  if (!bVar1) {
    iVar2 = -(int)lVar4;
  }
  return iVar2;
}

Assistant:

static int
timeval_to_relative_ms(struct timeval * tv)
{
  struct timeval now;
  struct timeval dt;
  long long t;
  int r;

  gettimeofday(&now, NULL);
  r = cmp_timeval(tv, &now);
  if (r >= 0) {
    timersub(tv, &now, &dt);
  } else {
    timersub(&now, tv, &dt);
  }
  t = dt.tv_sec;
  t *= 1000;
  t += (dt.tv_usec + 500) / 1000;

  if (t > INT_MAX) {
    t = INT_MAX;
  } else if (t < INT_MIN) {
    t = INT_MIN;
  }

  return r >= 0 ? t : -t;
}